

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross_containers.hpp
# Opt level: O2

SPIRFunction * __thiscall
diligent_spirv_cross::ObjectPool<diligent_spirv_cross::SPIRFunction>::
allocate<diligent_spirv_cross::SPIRFunction&>
          (ObjectPool<diligent_spirv_cross::SPIRFunction> *this,SPIRFunction *p)

{
  Vector<diligent_spirv_cross::SPIRFunction_*> *this_00;
  SPIRFunction *pSVar1;
  size_t sVar2;
  ulong count;
  bool bVar3;
  SPIRFunction *ptr;
  SPIRFunction *local_40;
  SPIRFunction *local_38;
  
  this_00 = &this->vacants;
  sVar2 = (this->vacants).super_VectorView<diligent_spirv_cross::SPIRFunction_*>.buffer_size;
  if (sVar2 == 0) {
    count = (ulong)(this->start_object_count <<
                   ((byte)(this->memory).
                          super_VectorView<std::unique_ptr<diligent_spirv_cross::SPIRFunction,_diligent_spirv_cross::ObjectPool<diligent_spirv_cross::SPIRFunction>::MallocDeleter>_>
                          .buffer_size & 0x1f));
    pSVar1 = (SPIRFunction *)malloc(count * 800);
    if (pSVar1 == (SPIRFunction *)0x0) {
      return (SPIRFunction *)0x0;
    }
    local_38 = pSVar1;
    SmallVector<diligent_spirv_cross::SPIRFunction_*,_0UL>::reserve(this_00,count);
    while (bVar3 = count != 0, count = count - 1, bVar3) {
      local_40 = pSVar1;
      SmallVector<diligent_spirv_cross::SPIRFunction_*,_0UL>::push_back(this_00,&local_40);
      pSVar1 = pSVar1 + 1;
    }
    SmallVector<std::unique_ptr<diligent_spirv_cross::SPIRFunction,diligent_spirv_cross::ObjectPool<diligent_spirv_cross::SPIRFunction>::MallocDeleter>,8ul>
    ::emplace_back<diligent_spirv_cross::SPIRFunction*&>
              ((SmallVector<std::unique_ptr<diligent_spirv_cross::SPIRFunction,diligent_spirv_cross::ObjectPool<diligent_spirv_cross::SPIRFunction>::MallocDeleter>,8ul>
                *)&this->memory,&local_38);
    sVar2 = (this->vacants).super_VectorView<diligent_spirv_cross::SPIRFunction_*>.buffer_size;
  }
  pSVar1 = (this_00->super_VectorView<diligent_spirv_cross::SPIRFunction_*>).ptr[sVar2 - 1];
  SmallVector<diligent_spirv_cross::SPIRFunction_*,_0UL>::pop_back(this_00);
  SPIRFunction::SPIRFunction(pSVar1,p);
  return pSVar1;
}

Assistant:

T *allocate(P &&... p)
	{
		if (vacants.empty())
		{
			unsigned num_objects = start_object_count << memory.size();
			T *ptr = static_cast<T *>(malloc(num_objects * sizeof(T)));
			if (!ptr)
				return nullptr;

			vacants.reserve(num_objects);
			for (unsigned i = 0; i < num_objects; i++)
				vacants.push_back(&ptr[i]);

			memory.emplace_back(ptr);
		}

		T *ptr = vacants.back();
		vacants.pop_back();
		new (ptr) T(std::forward<P>(p)...);
		return ptr;
	}